

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendrePolynomial.cpp
# Opt level: O0

void __thiscall OpenMD::LegendrePolynomial::GenerateFirstTwoTerms(LegendrePolynomial *this)

{
  DoublePolynomial p1;
  DoublePolynomial p0;
  double *coefficient;
  value_type *in_stack_ffffffffffffff78;
  value_type *__x;
  Polynomial<double> *in_stack_ffffffffffffff80;
  double local_38 [7];
  
  coefficient = local_38;
  Polynomial<double>::Polynomial((Polynomial<double> *)0x2ec63a);
  Polynomial<double>::setCoefficient
            (in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),coefficient);
  std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
            ((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  Polynomial<double>::Polynomial((Polynomial<double> *)0x2ec67a);
  __x = (value_type *)0x3ff0000000000000;
  Polynomial<double>::setCoefficient(in_stack_ffffffffffffff80,0x3ff00000,coefficient);
  std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::push_back
            ((vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_> *)
             in_stack_ffffffffffffff80,__x);
  Polynomial<double>::~Polynomial((Polynomial<double> *)0x2ec6bf);
  Polynomial<double>::~Polynomial((Polynomial<double> *)0x2ec6c9);
  return;
}

Assistant:

void LegendrePolynomial::GenerateFirstTwoTerms() {
    DoublePolynomial p0;
    p0.setCoefficient(0, 1.0);
    polyList_.push_back(p0);

    DoublePolynomial p1;
    p1.setCoefficient(1, 1.0);
    polyList_.push_back(p1);
  }